

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1156.c
# Opt level: O3

int test(char *URL)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  CURLcode CVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  undefined1 local_138 [264];
  
  iVar2 = curl_global_init(3);
  if (iVar2 == 0) {
    lVar5 = curl_easy_init();
    if (lVar5 != 0) {
      uVar3 = curl_easy_setopt(lVar5,0x4e2b,writedata);
      if (uVar3 == 0) {
        uVar3 = 0;
        lVar12 = 0;
        do {
          uVar1 = params[lVar12].flags;
          uVar9 = uVar1 & 2;
          curl_msnprintf(local_138,0x100,"%s%04u",URL,uVar1 >> 3 & 1 | uVar9);
          iVar2 = curl_easy_setopt(lVar5,0x2712,local_138);
          uVar8 = 1;
          if ((iVar2 == 0) && (iVar2 = curl_easy_setopt(lVar5,0x15,-(uVar1 & 1) & 3), iVar2 == 0)) {
            pcVar7 = (char *)0x0;
            if ((uVar1 & 1) == 0) {
              pcVar7 = "3-1000000";
            }
            iVar2 = curl_easy_setopt(lVar5,0x2717,pcVar7);
            if ((iVar2 == 0) && (iVar2 = curl_easy_setopt(lVar5,0x2d,uVar1 >> 2 & 1), iVar2 == 0)) {
              hasbody = 0;
              CVar4 = curl_easy_perform(lVar5);
              if (CVar4 == params[lVar12].result) {
                uVar8 = 0;
                if (((uVar1 & 0x10) == 0) || (uVar8 = 0, (hasbody & 1) == 0)) goto LAB_00102455;
                pcVar11 = "yes";
                pcVar7 = "yes";
                if ((uVar1 & 1) == 0) {
                  pcVar7 = "no";
                }
                pcVar6 = "yes";
                if ((uVar1 & 4) == 0) {
                  pcVar6 = "no";
                }
                pcVar10 = "yes";
                if (uVar9 == 0) {
                  pcVar10 = "no";
                }
                if ((uVar1 & 8) == 0) {
                  pcVar11 = "no";
                }
                curl_mfprintf(_stderr,
                              "body should be ignored and is not: resume=%s, fail=%s, http416=%s, content-range=%s\n"
                              ,pcVar7,pcVar6,pcVar10,pcVar11);
              }
              else {
                pcVar11 = "yes";
                pcVar7 = "yes";
                if ((uVar1 & 1) == 0) {
                  pcVar7 = "no";
                }
                pcVar6 = "yes";
                if ((uVar1 & 4) == 0) {
                  pcVar6 = "no";
                }
                pcVar10 = "yes";
                if (uVar9 == 0) {
                  pcVar10 = "no";
                }
                if ((uVar1 & 8) == 0) {
                  pcVar11 = "no";
                }
                curl_mfprintf(_stderr,
                              "bad error code (%d): resume=%s, fail=%s, http416=%s, content-range=%s, expected=%d\n"
                              ,CVar4,pcVar7,pcVar6,pcVar10,pcVar11,params[lVar12].result);
              }
              uVar8 = 1;
            }
          }
LAB_00102455:
          uVar3 = uVar3 | uVar8;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x10);
      }
      curl_easy_cleanup(lVar5);
      curl_global_cleanup();
      return uVar3;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;
  size_t i;
  int status = 0;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_WRITEFUNCTION, writedata);

  for(i = 0; i < sizeof(params) / sizeof(params[0]); i++)
    status |= onetest(curl, URL, params + i);

  curl_easy_cleanup(curl);
  curl_global_cleanup();
  return status;

  test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}